

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StreamUtils.cpp
# Opt level: O3

ostream * operator<<(ostream *lhs,EntityType *rhs)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(lhs,"EntityType (",0xc);
  DIS::EntityType::getEntityKind(rhs);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)lhs);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
  DIS::EntityType::getDomain(rhs);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
  DIS::EntityType::getCountry(rhs);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
  DIS::EntityType::getCategory(rhs);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
  DIS::EntityType::getSubcategory(rhs);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,") ",2);
  return lhs;
}

Assistant:

std::ostream& operator <<(std::ostream& lhs, const DIS::EntityType& rhs)
{
   lhs << "EntityType ("
       << (unsigned int)rhs.getEntityKind()
       << "," << (unsigned int)rhs.getDomain()
       << "," << (unsigned int)rhs.getCountry()
       << "," << (unsigned int)rhs.getCategory()
       << "," << (unsigned int)rhs.getSubcategory()
       << ") ";
   return lhs;
}